

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CodeGenWorkItem.cpp
# Opt level: O3

void __thiscall
CodeGenWorkItem::OnRemoveFromJitQueue(CodeGenWorkItem *this,NativeCodeGenerator *generator)

{
  code *pcVar1;
  bool bVar2;
  ScriptContext *pSVar3;
  undefined4 *puVar4;
  
  this->isInJitQueue = false;
  Js::EntryPointInfo::SetCodeGenPending(this->entryPointInfo);
  pSVar3 = Js::FunctionProxy::GetScriptContext((FunctionProxy *)this->functionBody);
  ThreadContext::UnregisterCodeGenRecyclableData(pSVar3->threadContext,this->recyclableData);
  this->recyclableData = (CodeGenRecyclableData *)0x0;
  if ((this->jitData).type == '\x01') {
    *(undefined4 *)
     &(this[1].super_Job.super_DoublyLinkedListElement<JsUtil::Job,_Memory::ArenaAllocator>.previous
      )->manager = 0;
    Js::EntryPointInfo::Reset(this->entryPointInfo,true);
    JsLoopBodyCodeGen::~JsLoopBodyCodeGen((JsLoopBodyCodeGen *)this);
    Memory::HeapAllocator::Free(&Memory::HeapAllocator::Instance,this,0xd0);
    return;
  }
  if ((this->jitData).jitMode != '\x04') {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/CodeGenWorkItem.cpp"
                       ,0xc1,"(GetJitMode() == ExecutionMode::FullJit)",
                       "GetJitMode() == ExecutionMode::FullJit");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  Js::FunctionBody::OnFullJitDequeued
            (this->functionBody,(FunctionEntryPointInfo *)this->entryPointInfo);
  NativeCodeGenerator::AddWorkItem(generator,this);
  return;
}

Assistant:

void CodeGenWorkItem::OnRemoveFromJitQueue(NativeCodeGenerator* generator)
{
    // This is called from within the lock

    this->isInJitQueue = false;
    this->entryPointInfo->SetCodeGenPending();
    functionBody->GetScriptContext()->GetThreadContext()->UnregisterCodeGenRecyclableData(this->recyclableData);
    this->recyclableData = nullptr;

    if(IS_JS_ETW(EventEnabledJSCRIPT_FUNCTION_JIT_DEQUEUED()))
    {
        WCHAR displayNameBuffer[256];
        WCHAR* displayName = displayNameBuffer;
        size_t sizeInChars = this->GetDisplayName(displayName, 256);
        if(sizeInChars > 256)
        {
            displayName = HeapNewArray(WCHAR, sizeInChars);
            this->GetDisplayName(displayName, 256);
        }
        JS_ETW(EventWriteJSCRIPT_FUNCTION_JIT_DEQUEUED(
            this->GetFunctionNumber(),
            displayName,
            this->GetScriptContext(),
            this->GetInterpretedCount()));

        if(displayName != displayNameBuffer)
        {
            HeapDeleteArray(sizeInChars, displayName);
        }
    }

    if(this->Type() == JsLoopBodyWorkItemType)
    {
        // Go ahead and delete it and let it re-queue if more interpreting of the loop happens
        auto loopBodyWorkItem = static_cast<JsLoopBodyCodeGen*>(this);
        loopBodyWorkItem->loopHeader->ResetInterpreterCount();
        loopBodyWorkItem->GetEntryPoint()->Reset(true);
        HeapDelete(loopBodyWorkItem);
    }
    else
    {
        Assert(GetJitMode() == ExecutionMode::FullJit); // simple JIT work items are not removed from the queue

        GetFunctionBody()->OnFullJitDequeued(static_cast<Js::FunctionEntryPointInfo *>(GetEntryPoint()));

        // Add it back to the list of available functions to be jitted
        generator->AddWorkItem(this);
    }
}